

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo
          (cmComputeLinkInformation *this,string *fullPath,cmTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  string soName;
  allocator local_49;
  string local_48;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_48,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_49);
  bVar1 = cmMakefile::IsOn(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((bVar1) && (bVar1 = cmTarget::HasMacOSXRpathInstallNameDir(target,&this->Config), !bVar1)) {
    return;
  }
  if (target->TargetTypeValue == SHARED_LIBRARY) {
    cmTarget::GetSOName(&local_48,target,&this->Config);
    if ((char *)local_48._M_string_length != (char *)0x0) {
      local_48._M_string_length = (size_type)local_48._M_dataplus._M_p;
    }
    cmOrderDirectories::AddRuntimeLibrary
              (this->OrderRuntimeSearchPath,fullPath,(char *)local_48._M_string_length);
    if (this->LinkWithRuntimePath == true) {
      cmOrderDirectories::AddRuntimeLibrary
                (this->OrderLinkerSearchPath,fullPath,(char *)local_48._M_string_length);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  else if (target->TargetTypeValue == UNKNOWN_LIBRARY) {
    AddLibraryRuntimeInfo(this,fullPath);
  }
  return;
}

Assistant:

void
cmComputeLinkInformation::AddLibraryRuntimeInfo(std::string const& fullPath,
                                                cmTarget const* target)
{
  // Ignore targets on Apple where install_name is not @rpath.
  // The dependenty library can be found with other means such as
  // @loader_path or full paths.
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    if(!target->HasMacOSXRpathInstallNameDir(this->Config))
      {
      return;
      }
    }

  // Libraries with unknown type must be handled using just the file
  // on disk.
  if(target->GetType() == cmTarget::UNKNOWN_LIBRARY)
    {
    this->AddLibraryRuntimeInfo(fullPath);
    return;
    }

  // Skip targets that are not shared libraries (modules cannot be linked).
  if(target->GetType() != cmTarget::SHARED_LIBRARY)
    {
    return;
    }

  // Try to get the soname of the library.  Only files with this name
  // could possibly conflict.
  std::string soName = target->GetSOName(this->Config);
  const char* soname = soName.empty()? 0 : soName.c_str();

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath, soname);
  if(this->LinkWithRuntimePath)
    {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath, soname);
    }
}